

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IO.cpp
# Opt level: O2

EngineFactoryEntry *
adios2::core::IO::NoEngineEntry(EngineFactoryEntry *__return_storage_ptr__,string *e)

{
  string sStack_58;
  string local_38;
  
  std::__cxx11::string::string((string *)&local_38,(string *)e);
  NoEngine(&__return_storage_ptr__->MakeReader,&local_38);
  std::__cxx11::string::string((string *)&sStack_58,(string *)e);
  NoEngine(&__return_storage_ptr__->MakeWriter,&sStack_58);
  (__return_storage_ptr__->MakeReaderWithMD).super__Function_base._M_manager = (_Manager_type)0x0;
  (__return_storage_ptr__->MakeReaderWithMD)._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(__return_storage_ptr__->MakeReaderWithMD).super__Function_base._M_functor = 0;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->MakeReaderWithMD).super__Function_base._M_functor + 8) = 0;
  std::__cxx11::string::~string((string *)&sStack_58);
  std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

IO::EngineFactoryEntry IO::NoEngineEntry(std::string e) { return {NoEngine(e), NoEngine(e)}; }